

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

int __thiscall QAccessibleTable::childCount(QAccessibleTable *this)

{
  int iVar1;
  int iVar2;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar3;
  QHeaderView *pQVar4;
  QHeaderView *pQVar5;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(&this->super_QAccessibleObject);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  iVar1 = 0;
  if (this_00 != (QAbstractItemView *)0x0) {
    pQVar3 = QAbstractItemView::model(this_00);
    iVar1 = 0;
    if (pQVar3 != (QAbstractItemModel *)0x0) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_00);
      pQVar4 = verticalHeader(this);
      pQVar5 = horizontalHeader(this);
      iVar1 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_58);
      iVar2 = (**(code **)(*(long *)this + 0x58))(this);
      iVar1 = ((iVar2 + 1) - (uint)(pQVar4 == (QHeaderView *)0x0)) *
              ((iVar1 + 1) - (uint)(pQVar5 == (QHeaderView *)0x0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::childCount() const
{
    const QAbstractItemView *theView = view();
    if (!theView)
        return 0;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return 0;
    const QModelIndex rootIndex = theView->rootIndex();
    int vHeader = verticalHeader() ? 1 : 0;
    int hHeader = horizontalHeader() ? 1 : 0;
    return (theModel->rowCount(rootIndex) + hHeader) * (columnCount() + vHeader);
}